

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::create_directory(path *p)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  string *in_RDI;
  filesystem_error *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  error_code *in_stack_00000048;
  path *in_stack_00000050;
  path *in_stack_00000058;
  bool result;
  error_code ec;
  int in_stack_000001ac;
  error_code *in_stack_ffffffffffffff60;
  error_category *in_stack_fffffffffffffff0;
  
  std::error_code::error_code(in_stack_ffffffffffffff60);
  path::path((path *)0x28e2a3);
  bVar1 = create_directory(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  path::~path((path *)0x28e2c8);
  bVar2 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe8);
  if (!bVar2) {
    return bVar1;
  }
  uVar3 = __cxa_allocate_exception(0x90);
  std::error_code::value((error_code *)&stack0xffffffffffffffe8);
  detail::systemErrorText<int>(in_stack_000001ac);
  filesystem_error::filesystem_error
            (unaff_retaddr,in_RDI,(path *)in_stack_fffffffffffffff0,(error_code)in_stack_00000008);
  __cxa_throw(uVar3,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE bool create_directory(const path& p)
{
    std::error_code ec;
    auto result = create_directory(p, path(), ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}